

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveMemberVarying::IfcStructuralCurveMemberVarying
          (IfcStructuralCurveMemberVarying *this)

{
  *(undefined ***)&(this->super_IfcStructuralCurveMember).field_0x160 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x168 = 0;
  *(char **)&this->field_0x170 = "IfcStructuralCurveMemberVarying";
  IfcStructuralCurveMember::IfcStructuralCurveMember
            (&this->super_IfcStructuralCurveMember,&PTR_construction_vtable_24__007e7250);
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject = 0x7e70f8;
  *(undefined8 *)&(this->super_IfcStructuralCurveMember).field_0x160 = 0x7e7238;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x7e7120;
  (this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x7e7148;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x7e7170;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x100 = 0x7e7198;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    super_IfcProduct.field_0x110 = 0x7e71c0;
  *(undefined8 *)
   &(this->super_IfcStructuralCurveMember).super_IfcStructuralMember.super_IfcStructuralItem.
    field_0x120 = 0x7e71e8;
  *(undefined8 *)&(this->super_IfcStructuralCurveMember).field_0x150 = 0x7e7210;
  return;
}

Assistant:

IfcStructuralCurveMemberVarying() : Object("IfcStructuralCurveMemberVarying") {}